

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

uint * If_DsdObjHashLookup(If_DsdMan_t *p,int Type,int *pLits,int nLits,int truthId)

{
  uint uVar1;
  int iVar2;
  If_DsdObj_t *pObj_00;
  uint *local_40;
  uint *pSpot;
  If_DsdObj_t *pObj;
  int truthId_local;
  int nLits_local;
  int *pLits_local;
  int Type_local;
  If_DsdMan_t *p_local;
  
  local_40 = p->pBins;
  uVar1 = If_DsdObjHashKey(p,Type,pLits,nLits,truthId);
  local_40 = local_40 + uVar1;
  do {
    if (*local_40 == 0) {
      p->nUniqueMisses = p->nUniqueMisses + 1;
      return local_40;
    }
    pObj_00 = If_DsdVecObj(&p->vObjs,*local_40);
    iVar2 = If_DsdObjType(pObj_00);
    if ((iVar2 == Type) && (iVar2 = If_DsdObjFaninNum(pObj_00), iVar2 == nLits)) {
      iVar2 = If_DsdObjFaninNum(pObj_00);
      iVar2 = memcmp(pObj_00 + 1,pLits,(long)iVar2 << 2);
      if ((iVar2 == 0) && (iVar2 = If_DsdObjTruthId(p,pObj_00), truthId == iVar2)) {
        p->nUniqueHits = p->nUniqueHits + 1;
        return local_40;
      }
    }
    local_40 = (uint *)Vec_IntEntryP(&p->vNexts,pObj_00->Id);
  } while( true );
}

Assistant:

unsigned * If_DsdObjHashLookup( If_DsdMan_t * p, int Type, int * pLits, int nLits, int truthId )
{
    If_DsdObj_t * pObj;
    unsigned * pSpot = p->pBins + If_DsdObjHashKey(p, Type, pLits, nLits, truthId);
    for ( ; *pSpot; pSpot = (unsigned *)Vec_IntEntryP(&p->vNexts, pObj->Id) )
    {
        pObj = If_DsdVecObj( &p->vObjs, *pSpot );
        if ( If_DsdObjType(pObj) == Type && 
             If_DsdObjFaninNum(pObj) == nLits && 
             !memcmp(pObj->pFans, pLits, sizeof(int)*If_DsdObjFaninNum(pObj)) &&
             truthId == If_DsdObjTruthId(p, pObj) )
        {
            p->nUniqueHits++;
            return pSpot;
        }
    }
    p->nUniqueMisses++;
    return pSpot;
}